

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_tests.cpp
# Opt level: O2

void __thiscall base64_tests::base64_testvectors::test_method(base64_testvectors *this)

{
  long lVar1;
  Span<const_unsigned_char> input;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  string *psVar5;
  long lVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string file;
  string_view str;
  const_string file_00;
  const_string file_01;
  initializer_list<unsigned_char> __l;
  initializer_list<std::byte> __l_00;
  const_string file_02;
  Span<const_unsigned_char> input_00;
  const_string file_03;
  Span<const_unsigned_char> input_01;
  const_string file_04;
  const_string file_05;
  string_view str_00;
  const_string file_06;
  string_view str_01;
  const_string file_07;
  string_view str_02;
  const_string file_08;
  string_view str_03;
  check_type cVar8;
  string *this_00;
  char *pcVar7;
  check_type cVar9;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  vector<std::byte,_std::allocator<std::byte>_> in_b;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_u;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  lazy_ostream local_110;
  undefined1 *local_100;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  allocator<char> local_99;
  string local_98;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> dec;
  string strEnc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (test_method()::vstrIn_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&test_method()::vstrIn_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)test_method()::vstrIn_abi_cxx11_,"",(allocator<char> *)&strEnc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::vstrIn_abi_cxx11_ + 1),"f",(allocator<char> *)&dec);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::vstrIn_abi_cxx11_ + 2),"fo",(allocator<char> *)&local_110
                );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::vstrIn_abi_cxx11_ + 3),"foo",(allocator<char> *)&local_98
                );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::vstrIn_abi_cxx11_ + 4),"foob",(allocator<char> *)&in_u);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::vstrIn_abi_cxx11_ + 5),"fooba",(allocator<char> *)&in_b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::vstrIn_abi_cxx11_ + 6),"foobar",&local_99);
      __cxa_atexit(::__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&test_method()::vstrIn_abi_cxx11_);
    }
  }
  if (test_method()::vstrOut_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&test_method()::vstrOut_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)test_method()::vstrOut_abi_cxx11_,"",(allocator<char> *)&strEnc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::vstrOut_abi_cxx11_ + 1),"Zg==",(allocator<char> *)&dec);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::vstrOut_abi_cxx11_ + 2),"Zm8=",
                 (allocator<char> *)&local_110);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::vstrOut_abi_cxx11_ + 3),"Zm9v",
                 (allocator<char> *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::vstrOut_abi_cxx11_ + 4),"Zm9vYg==",
                 (allocator<char> *)&in_u);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::vstrOut_abi_cxx11_ + 5),"Zm9vYmE=",
                 (allocator<char> *)&in_b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(test_method()::vstrOut_abi_cxx11_ + 6),"Zm9vYmFy",&local_99);
      __cxa_atexit(__cxx_global_array_dtor_19,0,&__dso_handle);
      __cxa_guard_release(&test_method()::vstrOut_abi_cxx11_);
    }
  }
  for (lVar6 = 0; psVar5 = &strEnc, lVar6 != 0xe0; lVar6 = lVar6 + 0x20) {
    EncodeBase64_abi_cxx11_
              (psVar5,*(Span<const_unsigned_char> *)
                       ((long)&test_method()::vstrIn_abi_cxx11_[0]._M_dataplus._M_p + lVar6));
    local_b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
    ;
    local_a8 = "";
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x17;
    file.m_begin = (iterator)&local_b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c0,msg);
    dec.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_payload._8_1_ = 0;
    dec.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "<W\x1b";
    dec.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    dec.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
    ;
    local_c8 = "";
    _cVar9 = (check_type)((long)&test_method()::vstrOut_abi_cxx11_[0]._M_dataplus._M_p + lVar6);
    pcVar7 = "vstrOut[i]";
    pvVar3 = (iterator)0x2;
    _cVar8 = _cVar9;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              ((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&dec,&local_d0,0x17,1,2,psVar5,"strEnc",(undefined8)_cVar9,"vstrOut[i]");
    str._M_str._2_1_ = strEnc._M_dataplus._M_p._2_1_;
    str._M_str._0_2_ = strEnc._M_dataplus._M_p._0_2_;
    str._M_str._3_5_ = strEnc._M_dataplus._M_p._3_5_;
    str._M_len = strEnc._M_string_length;
    DecodeBase64(&dec,str);
    local_e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
    ;
    local_d8 = "";
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)psVar5;
    msg_00.m_begin = pvVar3;
    file_00.m_end = (iterator)0x19;
    file_00.m_begin = (iterator)&local_e0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_f0,
               msg_00);
    local_98._M_dataplus._M_p._0_1_ =
         dec.
         super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
         _M_engaged;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "dec";
    in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    local_110.m_empty = false;
    local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_100 = boost::unit_test::lazy_ostream::inst;
    local_f8 = &in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
    ;
    local_118 = "";
    pvVar3 = (iterator)0x2;
    pvVar4 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_98,&local_110,2,0,WARN,_cVar8,(size_t)&local_120,0x19,
               pcVar7,lVar6,(undefined8)_cVar9);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_98.field_2._M_allocated_capacity);
    local_130 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
    ;
    local_128 = "";
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    local_138 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = pvVar4;
    msg_01.m_begin = pvVar3;
    file_01.m_end = &DAT_0000001a;
    file_01.m_begin = (iterator)&local_130;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_140,
               msg_01);
    local_98._M_dataplus._M_p._0_1_ =
         std::ranges::__equal_fn::
         operator()<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                   ((__equal_fn *)&std::ranges::equal,
                    (_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&dec,(long)&test_method()::vstrIn_abi_cxx11_[0]._M_dataplus._M_p + lVar6);
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    local_110.m_empty = false;
    local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139e30;
    local_100 = boost::unit_test::lazy_ostream::inst;
    local_150 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
    ;
    local_148 = "";
    in_R8 = &DAT_00000001;
    in_R9 = &DAT_00000001;
    local_f8 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)_cVar9;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_98,&local_110,1,1,WARN,_cVar8,(size_t)&local_150,0x1a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_98.field_2._M_allocated_capacity);
    std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    _M_reset((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             &dec);
    std::__cxx11::string::~string((string *)&strEnc);
  }
  strEnc._M_dataplus._M_p._0_2_ = 0x1ff;
  strEnc._M_dataplus._M_p._2_1_ = 0xff;
  __l._M_len = 3;
  __l._M_array = (iterator)&strEnc;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&in_u,__l,(allocator_type *)&dec);
  strEnc._M_dataplus._M_p._0_2_ = 0x1ff;
  strEnc._M_dataplus._M_p._2_1_ = 0xff;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&strEnc;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(&in_b,__l_00,(allocator_type *)&dec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strEnc,anon_var_dwarf_278464,(allocator<char> *)&dec);
  this_00 = (string *)&dec;
  std::__cxx11::string::string<std::allocator<char>>(this_00,"/wH/",(allocator<char> *)&local_110);
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = &DAT_00000022;
  file_02.m_begin = (iterator)&local_190;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a0,
             msg_02);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)0xc694e1;
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_1a8 = "";
  input_00.m_size =
       (long)in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  input_00.m_data =
       in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  EncodeBase64_abi_cxx11_(&local_98,input_00);
  pvVar3 = (iterator)0x2;
  psVar5 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_110,&local_1b0,0x22,1,2,psVar5,"EncodeBase64(in_u)",this_00,"out_exp");
  std::__cxx11::string::~string((string *)&local_98);
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)psVar5;
  msg_03.m_begin = pvVar3;
  file_03.m_end = (iterator)0x23;
  file_03.m_begin = (iterator)&local_1c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1d0,
             msg_03);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)0xc694e1;
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_1d8 = "";
  input_01.m_size =
       (long)in_b.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)in_b.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  input_01.m_data =
       in_b.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  EncodeBase64_abi_cxx11_(&local_98,input_01);
  pvVar3 = (iterator)0x2;
  psVar5 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_110,&local_1e0,0x23,1,2,psVar5,"EncodeBase64(in_b)",this_00,"out_exp");
  std::__cxx11::string::~string((string *)&local_98);
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)psVar5;
  msg_04.m_begin = pvVar3;
  file_04.m_end = (iterator)0x24;
  file_04.m_begin = (iterator)&local_1f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_200,
             msg_04);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)0xc694e1;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_208 = "";
  input.m_data._2_1_ = strEnc._M_dataplus._M_p._2_1_;
  input.m_data._0_2_ = strEnc._M_dataplus._M_p._0_2_;
  input.m_data._3_5_ = strEnc._M_dataplus._M_p._3_5_;
  input.m_size = strEnc._M_string_length;
  EncodeBase64_abi_cxx11_(&local_98,input);
  pvVar3 = (iterator)0x2;
  psVar5 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_110,&local_210,0x24,1,2,psVar5,"EncodeBase64(in_s)",this_00,"out_exp");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&dec);
  std::__cxx11::string::~string((string *)&strEnc);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&in_b.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)psVar5;
  msg_05.m_begin = pvVar3;
  file_05.m_end = &DAT_00000028;
  file_05.m_begin = (iterator)&local_220;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_230,
             msg_05);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dec,"invalid",8
              );
  str_00._M_len._1_7_ =
       dec.
       super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
       .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
       _M_payload._9_7_;
  str_00._M_len._0_1_ =
       dec.
       super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
       .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
       _M_payload._8_1_;
  str_00._M_str =
       (char *)dec.
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  DecodeBase64((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)&strEnc,
               str_00);
  local_98._M_dataplus._M_p._0_1_ = strEnc.field_2._M_local_buf[8] ^ 1;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "!DecodeBase64(\"invalid\\0\"s)";
  in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_238 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_f8 = &in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,&local_110,1,0,WARN,(check_type)this_00,
             (size_t)&local_240,0x28);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::_M_reset
            ((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             &strEnc);
  std::__cxx11::string::~string((string *)&dec);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  file_06.m_end = (iterator)0x29;
  file_06.m_begin = (iterator)&local_250;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_260,
             msg_06);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dec,"nQB/pZw=",
               8);
  str_01._M_len._1_7_ =
       dec.
       super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
       .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
       _M_payload._9_7_;
  str_01._M_len._0_1_ =
       dec.
       super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
       .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
       _M_payload._8_1_;
  str_01._M_str =
       (char *)dec.
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  DecodeBase64((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)&strEnc,
               str_01);
  local_98._M_dataplus._M_p._0_1_ = strEnc.field_2._M_local_buf[8];
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "DecodeBase64(\"nQB/pZw=\"s)";
  in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_268 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_f8 = &in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,&local_110,1,0,WARN,(check_type)this_00,
             (size_t)&local_270,0x29);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::_M_reset
            ((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             &strEnc);
  std::__cxx11::string::~string((string *)&dec);
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  file_07.m_end = (iterator)0x2a;
  file_07.m_begin = (iterator)&local_280;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_290,
             msg_07);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dec,"nQB/pZw=",
               0x10);
  str_02._M_len._1_7_ =
       dec.
       super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
       .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
       _M_payload._9_7_;
  str_02._M_len._0_1_ =
       dec.
       super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
       .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
       _M_payload._8_1_;
  str_02._M_str =
       (char *)dec.
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  DecodeBase64((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)&strEnc,
               str_02);
  local_98._M_dataplus._M_p._0_1_ = strEnc.field_2._M_local_buf[8] ^ 1;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "!DecodeBase64(\"nQB/pZw=\\0invalid\"s)";
  in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_298 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_f8 = &in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,&local_110,1,0,WARN,(check_type)this_00,
             (size_t)&local_2a0,0x2a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::_M_reset
            ((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             &strEnc);
  std::__cxx11::string::~string((string *)&dec);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  file_08.m_end = (iterator)0x2b;
  file_08.m_begin = (iterator)&local_2b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2c0,
             msg_08);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dec,
               "nQB/pZw=invalid",0x10);
  str_03._M_len._1_7_ =
       dec.
       super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
       .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
       _M_payload._9_7_;
  str_03._M_len._0_1_ =
       dec.
       super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
       .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
       _M_payload._8_1_;
  str_03._M_str =
       (char *)dec.
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  DecodeBase64((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)&strEnc,
               str_03);
  local_98._M_dataplus._M_p._0_1_ = strEnc.field_2._M_local_buf[8] ^ 1;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "!DecodeBase64(\"nQB/pZw=invalid\\0\"s)";
  in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
  ;
  local_2c8 = "";
  local_f8 = &in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,&local_110,1,0,WARN,(check_type)this_00,
             (size_t)&local_2d0,0x2b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::_M_reset
            ((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             &strEnc);
  std::__cxx11::string::~string((string *)&dec);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(base64_testvectors)
{
    static const std::string vstrIn[]  = {"","f","fo","foo","foob","fooba","foobar"};
    static const std::string vstrOut[] = {"","Zg==","Zm8=","Zm9v","Zm9vYg==","Zm9vYmE=","Zm9vYmFy"};
    for (unsigned int i=0; i<std::size(vstrIn); i++)
    {
        std::string strEnc = EncodeBase64(vstrIn[i]);
        BOOST_CHECK_EQUAL(strEnc, vstrOut[i]);
        auto dec = DecodeBase64(strEnc);
        BOOST_REQUIRE(dec);
        BOOST_CHECK_MESSAGE(std::ranges::equal(*dec, vstrIn[i]), vstrOut[i]);
    }

    {
        const std::vector<uint8_t> in_u{0xff, 0x01, 0xff};
        const std::vector<std::byte> in_b{std::byte{0xff}, std::byte{0x01}, std::byte{0xff}};
        const std::string in_s{"\xff\x01\xff"};
        const std::string out_exp{"/wH/"};
        BOOST_CHECK_EQUAL(EncodeBase64(in_u), out_exp);
        BOOST_CHECK_EQUAL(EncodeBase64(in_b), out_exp);
        BOOST_CHECK_EQUAL(EncodeBase64(in_s), out_exp);
    }

    // Decoding strings with embedded NUL characters should fail
    BOOST_CHECK(!DecodeBase64("invalid\0"s));
    BOOST_CHECK(DecodeBase64("nQB/pZw="s));
    BOOST_CHECK(!DecodeBase64("nQB/pZw=\0invalid"s));
    BOOST_CHECK(!DecodeBase64("nQB/pZw=invalid\0"s));
}